

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

int mbedtls_cipher_crypt
              (mbedtls_cipher_context_t *ctx,uchar *iv,size_t iv_len,uchar *input,size_t ilen,
              uchar *output,size_t *olen)

{
  mbedtls_cipher_info_t *pmVar1;
  int iVar2;
  size_t __n;
  size_t finish_olen;
  size_t local_38;
  
  iVar2 = -0x6100;
  if (ctx != (mbedtls_cipher_context_t *)0x0) {
    local_38 = 0xffff9f00;
    pmVar1 = ctx->cipher_info;
    if ((iv != (uchar *)0x0 && pmVar1 != (mbedtls_cipher_info_t *)0x0) &&
       (iVar2 = -0x6080, iv_len < 0x11)) {
      __n = iv_len;
      if (((pmVar1->flags & 1) == 0) && (__n = (size_t)pmVar1->iv_size, iv_len < __n)) {
        return -0x6100;
      }
      memcpy(ctx->iv,iv,__n);
      ctx->iv_size = __n;
      ctx->unprocessed_len = 0;
      iVar2 = mbedtls_cipher_update(ctx,input,ilen,output,olen);
      if ((iVar2 == 0) && (iVar2 = mbedtls_cipher_finish(ctx,output + *olen,&local_38), iVar2 == 0))
      {
        *olen = *olen + local_38;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_cipher_crypt( mbedtls_cipher_context_t *ctx,
                  const unsigned char *iv, size_t iv_len,
                  const unsigned char *input, size_t ilen,
                  unsigned char *output, size_t *olen )
{
    int ret;
    size_t finish_olen;

    if( ( ret = mbedtls_cipher_set_iv( ctx, iv, iv_len ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_reset( ctx ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_update( ctx, input, ilen, output, olen ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_finish( ctx, output + *olen, &finish_olen ) ) != 0 )
        return( ret );

    *olen += finish_olen;

    return( 0 );
}